

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void __thiscall gimage::VEdge::VEdge(VEdge *this,long x0,long y0,long x1,long y1)

{
  long y1_local;
  long x1_local;
  long y0_local;
  long x0_local;
  VEdge *this_local;
  
  if (y1 < y0) {
    if (y1 < y0) {
      this->ymin = y1;
      this->ymax = y0;
      this->xstart = x1;
      this->xend = x0;
    }
  }
  else {
    this->ymin = y0;
    this->ymax = y1;
    this->xstart = x0;
    this->xend = x1;
  }
  this->xc = this->xstart;
  return;
}

Assistant:

VEdge::VEdge(long x0, long y0, long x1, long y1)
{
  if (y0 <= y1)
  {
    ymin=y0;
    ymax=y1;
    xstart=x0;
    xend=x1;
  }
  else if (y1 < y0)
  {
    ymin=y1;
    ymax=y0;
    xstart=x1;
    xend=x0;
  }

  xc=xstart;
}